

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title.c
# Opt level: O2

void set_title(char *title)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  int64_t eval_b;
  int64_t eval_a;
  char buffer [512];
  
  iVar1 = uv_get_process_title(buffer,0x200);
  eval_a = (int64_t)iVar1;
  if (eval_a == 0) {
    iVar1 = uv_set_process_title(title);
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      iVar1 = uv_get_process_title(buffer,0x200);
      eval_a = (int64_t)iVar1;
      if (eval_a == 0) {
        iVar1 = strcmp(buffer,title);
        eval_a = (int64_t)iVar1;
        if (eval_a == 0) {
          return;
        }
        pcVar2 = "strcmp(buffer, title)";
        uVar3 = 0x28;
      }
      else {
        pcVar2 = "err";
        uVar3 = 0x26;
      }
    }
    else {
      pcVar2 = "err";
      uVar3 = 0x23;
    }
  }
  else {
    pcVar2 = "err";
    uVar3 = 0x20;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-title.c"
          ,uVar3,pcVar2,"==","0",eval_a,"==",0);
  abort();
}

Assistant:

static void set_title(const char* title) {
  char buffer[512];
  int err;

  err = uv_get_process_title(buffer, sizeof(buffer));
  ASSERT_OK(err);

  err = uv_set_process_title(title);
  ASSERT_OK(err);

  err = uv_get_process_title(buffer, sizeof(buffer));
  ASSERT_OK(err);

  ASSERT_OK(strcmp(buffer, title));
}